

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CodeSinkingPass::SinkInstruction(CodeSinkingPass *this,Instruction *inst)

{
  bool bVar1;
  BasicBlock *block;
  Instruction *pos;
  
  if ((((inst->opcode_ == OpAccessChain) || (inst->opcode_ == OpLoad)) &&
      (bVar1 = ReferencesMutableMemory(this,inst), !bVar1)) &&
     (block = FindNewBasicBlockFor(this,inst), block != (BasicBlock *)0x0)) {
    pos = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
          super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    while (pos->opcode_ == OpPhi) {
      pos = (pos->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pos->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pos = (Instruction *)0x0;
      }
    }
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (&inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>,pos);
    IRContext::set_instr_block((this->super_Pass).context_,inst,block);
    return true;
  }
  return false;
}

Assistant:

bool CodeSinkingPass::SinkInstruction(Instruction* inst) {
  if (inst->opcode() != spv::Op::OpLoad &&
      inst->opcode() != spv::Op::OpAccessChain) {
    return false;
  }

  if (ReferencesMutableMemory(inst)) {
    return false;
  }

  if (BasicBlock* target_bb = FindNewBasicBlockFor(inst)) {
    Instruction* pos = &*target_bb->begin();
    while (pos->opcode() == spv::Op::OpPhi) {
      pos = pos->NextNode();
    }

    inst->InsertBefore(pos);
    context()->set_instr_block(inst, target_bb);
    return true;
  }
  return false;
}